

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereLoopCheaperProperSubset(WhereLoop *pX,WhereLoop *pY)

{
  uint local_28;
  uint local_24;
  int j;
  int i;
  WhereLoop *pY_local;
  WhereLoop *pX_local;
  
  if ((pY->rRun < pX->rRun) && (pY->nOut < pX->nOut)) {
    pX_local._4_4_ = 0;
  }
  else if (((pX->u).btree.nEq < (pY->u).btree.nEq) &&
          ((((pX->u).btree.pIndex == (pY->u).btree.pIndex && (pX->nSkip == 0)) && (pY->nSkip == 0)))
          ) {
    pX_local._4_4_ = 1;
  }
  else if ((int)((uint)pX->nLTerm - (uint)pX->nSkip) < (int)((uint)pY->nLTerm - (uint)pY->nSkip)) {
    if (pX->nSkip < pY->nSkip) {
      pX_local._4_4_ = 0;
    }
    else {
      local_24 = (uint)pX->nLTerm;
      do {
        do {
          local_24 = local_24 - 1;
          if ((int)local_24 < 0) {
            if (((pX->wsFlags & 0x40) != 0) && ((pY->wsFlags & 0x40) == 0)) {
              return 0;
            }
            return 1;
          }
        } while (pX->aLTerm[(int)local_24] == (WhereTerm *)0x0);
        local_28 = (uint)pY->nLTerm;
        do {
          local_28 = local_28 - 1;
          if ((int)local_28 < 0) break;
        } while (pY->aLTerm[(int)local_28] != pX->aLTerm[(int)local_24]);
      } while (-1 < (int)local_28);
      pX_local._4_4_ = 0;
    }
  }
  else {
    pX_local._4_4_ = 0;
  }
  return pX_local._4_4_;
}

Assistant:

static int whereLoopCheaperProperSubset(
  const WhereLoop *pX,       /* First WhereLoop to compare */
  const WhereLoop *pY        /* Compare against this WhereLoop */
){
  int i, j;
  if( pX->rRun>pY->rRun && pX->nOut>pY->nOut ) return 0; /* (1d) and (2a) */
  assert( (pX->wsFlags & WHERE_VIRTUALTABLE)==0 );
  assert( (pY->wsFlags & WHERE_VIRTUALTABLE)==0 );
  if( pX->u.btree.nEq < pY->u.btree.nEq                  /* (1b) */
   && pX->u.btree.pIndex==pY->u.btree.pIndex             /* (1a) */
   && pX->nSkip==0 && pY->nSkip==0                       /* (1c) */
  ){
    return 1;  /* Case 1 is true */
  }
  if( pX->nLTerm-pX->nSkip >= pY->nLTerm-pY->nSkip ){
    return 0;                                            /* (2b) */
  }
  if( pY->nSkip > pX->nSkip ) return 0;                  /* (2d) */
  for(i=pX->nLTerm-1; i>=0; i--){
    if( pX->aLTerm[i]==0 ) continue;
    for(j=pY->nLTerm-1; j>=0; j--){
      if( pY->aLTerm[j]==pX->aLTerm[i] ) break;
    }
    if( j<0 ) return 0;                                  /* (2c) */
  }
  if( (pX->wsFlags&WHERE_IDX_ONLY)!=0
   && (pY->wsFlags&WHERE_IDX_ONLY)==0 ){
    return 0;                                            /* (2e) */
  }
  return 1;  /* Case 2 is true */
}